

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

void Update_Chan_Algo0_LFO_Int(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  if (length != 0 && CH->SLOT[3].Ecnt != 0x20000000) {
    uVar9 = 0;
    do {
      iVar2 = CH->SLOT[0].Fcnt;
      YM2612->in0 = iVar2;
      iVar3 = CH->SLOT[2].Fcnt;
      YM2612->in1 = iVar3;
      iVar4 = CH->SLOT[1].Fcnt;
      YM2612->in2 = iVar4;
      iVar8 = CH->SLOT[3].Fcnt;
      YM2612->in3 = iVar8;
      uVar5 = YM2612->LFO_FREQ_UP[uVar9] * CH->FMS;
      if (uVar5 < 0x200) {
        iVar2 = iVar2 + CH->SLOT[0].Finc;
        iVar3 = iVar3 + CH->SLOT[2].Finc;
        iVar4 = iVar4 + CH->SLOT[1].Finc;
        iVar7 = CH->SLOT[3].Finc;
      }
      else {
        iVar6 = (int)uVar5 >> 9;
        iVar7 = CH->SLOT[0].Finc;
        iVar1 = CH->SLOT[1].Finc;
        iVar2 = iVar2 + iVar7 + (iVar7 * iVar6 >> 9);
        iVar7 = CH->SLOT[2].Finc;
        iVar3 = iVar3 + iVar7 + (iVar7 * iVar6 >> 9);
        iVar4 = iVar4 + iVar1 + (iVar1 * iVar6 >> 9);
        iVar7 = CH->SLOT[3].Finc;
        iVar7 = (iVar6 * iVar7 >> 9) + iVar7;
      }
      CH->SLOT[0].Fcnt = iVar2;
      CH->SLOT[2].Fcnt = iVar3;
      CH->SLOT[1].Fcnt = iVar4;
      CH->SLOT[3].Fcnt = iVar7 + iVar8;
      iVar2 = YM2612->LFO_ENV_UP[uVar9];
      iVar3 = CH->SLOT[0].Ecnt;
      uVar5 = CH->SLOT[0].TLL + ENV_TAB[iVar3 >> 0x10];
      if ((CH->SLOT[0].SEG & 4) == 0) {
        iVar4 = uVar5 + (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f));
      }
      else {
        iVar4 = 0;
        if ((int)uVar5 < 0x1000) {
          iVar4 = (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f)) + (uVar5 ^ 0xfff);
        }
      }
      YM2612->en0 = iVar4;
      iVar4 = CH->SLOT[2].Ecnt;
      uVar5 = CH->SLOT[2].TLL + ENV_TAB[iVar4 >> 0x10];
      if ((CH->SLOT[2].SEG & 4) == 0) {
        iVar8 = uVar5 + (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f));
      }
      else {
        iVar8 = 0;
        if ((int)uVar5 < 0x1000) {
          iVar8 = (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f)) + (uVar5 ^ 0xfff);
        }
      }
      YM2612->en1 = iVar8;
      uVar5 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      if ((CH->SLOT[1].SEG & 4) == 0) {
        iVar8 = uVar5 + (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f));
      }
      else {
        iVar8 = 0;
        if ((int)uVar5 < 0x1000) {
          iVar8 = (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f)) + (uVar5 ^ 0xfff);
        }
      }
      YM2612->en2 = iVar8;
      uVar5 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
      if ((CH->SLOT[3].SEG & 4) == 0) {
        iVar8 = uVar5 + (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f));
      }
      else {
        iVar8 = 0;
        if ((int)uVar5 < 0x1000) {
          iVar8 = (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f)) + (uVar5 ^ 0xfff);
        }
      }
      YM2612->en3 = iVar8;
      iVar3 = iVar3 + CH->SLOT[0].Einc;
      CH->SLOT[0].Ecnt = iVar3;
      if (CH->SLOT[0].Ecmp <= iVar3) {
        (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
        iVar4 = CH->SLOT[2].Ecnt;
      }
      iVar4 = iVar4 + CH->SLOT[2].Einc;
      CH->SLOT[2].Ecnt = iVar4;
      if (CH->SLOT[2].Ecmp <= iVar4) {
        (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
      }
      iVar2 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
      CH->SLOT[1].Ecnt = iVar2;
      if (CH->SLOT[1].Ecmp <= iVar2) {
        (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
      }
      iVar2 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
      CH->SLOT[3].Ecnt = iVar2;
      if (CH->SLOT[3].Ecmp <= iVar2) {
        (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
      }
      YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
      iVar2 = CH->S0_OUT[0];
      CH->S0_OUT[1] = iVar2;
      CH->S0_OUT[0] =
           *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                   (long)YM2612->en0 * 4);
      uVar5 = iVar2 + YM2612->in1;
      YM2612->in1 = uVar5;
      uVar5 = YM2612->in2 +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar5 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en1 * 4);
      YM2612->in2 = uVar5;
      uVar5 = YM2612->in3 +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar5 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en2 * 4);
      YM2612->in3 = uVar5;
      iVar2 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar5 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en3 * 4) >> 0xf;
      CH->OUTd = iVar2;
      uVar5 = YM2612->Inter_Cnt + YM2612->Inter_Step;
      YM2612->Inter_Cnt = uVar5;
      if ((uVar5 >> 0xe & 1) != 0) {
        uVar5 = uVar5 & 0x3fff;
        YM2612->Inter_Cnt = uVar5;
        uVar5 = uVar5 * CH->Old_OUTd + (uVar5 ^ 0x3fff) * iVar2 >> 0xe;
        CH->Old_OUTd = uVar5;
        (*buf)[uVar9] = (*buf)[uVar9] + (uVar5 & CH->LEFT);
        buf[1][uVar9] = buf[1][uVar9] + (CH->RIGHT & CH->Old_OUTd);
        uVar9 = (ulong)((int)uVar9 + 1);
        iVar2 = CH->OUTd;
      }
      CH->Old_OUTd = iVar2;
    } while ((uint)uVar9 < length);
  }
  return;
}

Assistant:

static void Update_Chan_Algo0_LFO_Int(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if (CH->SLOT[S3].Ecnt == ENV_END)
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 0 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_0
    DO_OUTPUT_INT
  }
}